

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  ostream *poVar4;
  PolicyID id;
  __node_base *p_Var5;
  pointer source;
  pointer source_00;
  string local_360;
  allocator local_340 [32];
  string dirs;
  ostringstream w;
  
  PVar2 = GetPolicyStatus(this,CMP0019);
  if (PVar2 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    std::__cxx11::string::string((string *)&dirs,"INCLUDE_DIRECTORIES",(allocator *)&local_360);
    pcVar3 = GetProperty(this,&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    bVar1 = mightExpandVariablesCMP0019(pcVar3);
    if (bVar1) {
      std::__cxx11::string::string((string *)&dirs,pcVar3,(allocator *)&local_360);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if (PVar2 == WARN) {
        bVar1 = std::operator!=(&dirs,pcVar3);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n");
          poVar4 = std::operator<<(poVar4,"  ");
          poVar4 = std::operator<<(poVar4,pcVar3);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"as\n");
          poVar4 = std::operator<<(poVar4,"  ");
          poVar4 = std::operator<<(poVar4,(string *)&dirs);
          std::operator<<(poVar4,"\n");
        }
      }
      std::__cxx11::string::string((string *)&local_360,"INCLUDE_DIRECTORIES",local_340);
      SetProperty(this,&local_360,dirs._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&dirs);
    }
    p_Var5 = &(this->Targets)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      if (*(int *)&p_Var5[0x61]._M_nxt != 7) {
        std::__cxx11::string::string((string *)&dirs,"INCLUDE_DIRECTORIES",(allocator *)&local_360);
        pcVar3 = cmTarget::GetProperty((cmTarget *)(p_Var5 + 5),&dirs);
        std::__cxx11::string::~string((string *)&dirs);
        bVar1 = mightExpandVariablesCMP0019(pcVar3);
        if (bVar1) {
          std::__cxx11::string::string((string *)&dirs,pcVar3,(allocator *)&local_360);
          ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
          if (PVar2 == WARN) {
            bVar1 = std::operator!=(&dirs,pcVar3);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&w,"Evaluated target ");
              poVar4 = std::operator<<(poVar4,(string *)(p_Var5 + 0x3a));
              poVar4 = std::operator<<(poVar4," INCLUDE_DIRECTORIES\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,pcVar3);
              poVar4 = std::operator<<(poVar4,"\n");
              poVar4 = std::operator<<(poVar4,"as\n");
              poVar4 = std::operator<<(poVar4,"  ");
              poVar4 = std::operator<<(poVar4,(string *)&dirs);
              std::operator<<(poVar4,"\n");
            }
          }
          std::__cxx11::string::string((string *)&local_360,"INCLUDE_DIRECTORIES",local_340);
          cmTarget::SetProperty((cmTarget *)(p_Var5 + 5),&local_360,dirs._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&dirs);
        }
      }
    }
    for (source = (this->LinkDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        source != (this->LinkDirectories).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
      bVar1 = mightExpandVariablesCMP0019((source->_M_dataplus)._M_p);
      if (bVar1) {
        std::__cxx11::string::string((string *)&dirs,(string *)source);
        ExpandVariablesInString(this,source,true,true,false,(char *)0x0,-1,false,false);
        if (PVar2 == WARN) {
          bVar1 = std::operator!=(source,&dirs);
          if (bVar1) {
            poVar4 = std::operator<<((ostream *)&w,"Evaluated link directory\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,(string *)&dirs);
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"as\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,(string *)source);
            std::operator<<(poVar4,"\n");
          }
        }
        std::__cxx11::string::~string((string *)&dirs);
      }
    }
    for (source_00 = (this->LinkLibraries).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        source_00 !=
        (this->LinkLibraries).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; source_00 = source_00 + 1) {
      bVar1 = mightExpandVariablesCMP0019((source_00->first)._M_dataplus._M_p);
      if (bVar1) {
        std::__cxx11::string::string((string *)&dirs,(string *)source_00);
        ExpandVariablesInString(this,&source_00->first,true,true,false,(char *)0x0,-1,false,false);
        if (PVar2 == WARN) {
          bVar1 = std::operator!=(&source_00->first,&dirs);
          if (bVar1) {
            poVar4 = std::operator<<((ostream *)&w,"Evaluated link library\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,(string *)&dirs);
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"as\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,(string *)source_00);
            std::operator<<(poVar4,"\n");
          }
        }
        std::__cxx11::string::~string((string *)&dirs);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&dirs);
    if (dirs._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_360,(cmPolicies *)0x13,id);
      poVar4 = std::operator<<((ostream *)&dirs,(string *)&local_360);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"The following variable evaluations were encountered:\n");
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar4,(string *)local_340);
      std::__cxx11::string::~string((string *)local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if(pol != cmPolicies::OLD && pol != cmPolicies::WARN)
    {
    return;
    }
  std::ostringstream w;

  const char *includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if(mightExpandVariablesCMP0019(includeDirs))
    {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if(pol == cmPolicies::WARN && dirs != includeDirs)
      {
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (cmTargets::iterator l = this->Targets.begin();
       l != this->Targets.end(); ++l)
    {
    cmTarget &t = l->second;
    if (t.GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if(mightExpandVariablesCMP0019(includeDirs))
      {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if(pol == cmPolicies::WARN && dirs != includeDirs)
        {
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
      }
    }

  for(std::vector<std::string>::iterator d = this->LinkDirectories.begin();
      d != this->LinkDirectories.end(); ++d)
    {
    if(mightExpandVariablesCMP0019(d->c_str()))
      {
      std::string orig = *d;
      this->ExpandVariablesInString(*d, true, true);
      if(pol == cmPolicies::WARN && *d != orig)
        {
        w << "Evaluated link directory\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << *d << "\n";
        }
      }
    }
  for(cmTarget::LinkLibraryVectorType::iterator l =
        this->LinkLibraries.begin();
      l != this->LinkLibraries.end(); ++l)
    {
    if(mightExpandVariablesCMP0019(l->first.c_str()))
      {
      std::string orig = l->first;
      this->ExpandVariablesInString(l->first, true, true);
      if(pol == cmPolicies::WARN && l->first != orig)
        {
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << l->first << "\n";
        }
      }
    }

  if(!w.str().empty())
    {
    std::ostringstream m;
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    this->IssueMessage(cmake::AUTHOR_WARNING, m.str());
    }
}